

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

string * __thiscall
google::protobuf::DescriptorPool::Tables::
AllocateStringArray<google::protobuf::stringpiece_internal::StringPiece&,google::protobuf::stringpiece_internal::StringPiece&>
          (Tables *this,StringPiece *values,StringPiece *values_1)

{
  pointer pvVar1;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
  local_68;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
  *local_28;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL> *array
  ;
  StringPiece *values_local_1;
  StringPiece *values_local;
  Tables *this_local;
  
  array = (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
           *)values_1;
  values_local_1 = values;
  values_local = (StringPiece *)this;
  local_28 = (anonymous_namespace)::TableArena::Create<std::array<std::__cxx11::string,2ul>>
                       ((TableArena *)&this->arena_);
  stringpiece_internal::StringPiece::operator_cast_to_string(local_68._M_elems,values_local_1);
  stringpiece_internal::StringPiece::operator_cast_to_string
            (local_68._M_elems + 1,(StringPiece *)array);
  std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>::
  operator=(local_28,&local_68);
  std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>::
  ~array(&local_68);
  pvVar1 = std::
           array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
           ::data(local_28);
  return pvVar1;
}

Assistant:

const std::string* DescriptorPool::Tables::AllocateStringArray(In&&... values) {
  auto& array = *arena_.Create<std::array<std::string, sizeof...(In)>>();
  array = {{std::string(std::forward<In>(values))...}};
  return array.data();
}